

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::scheduler_operation>::pop
          (op_queue<asio::detail::scheduler_operation> *this)

{
  scheduler_operation *psVar1;
  scheduler_operation *local_18;
  scheduler_operation *tmp;
  op_queue<asio::detail::scheduler_operation> *this_local;
  
  if (this->front_ != (scheduler_operation *)0x0) {
    local_18 = this->front_;
    tmp = (scheduler_operation *)this;
    psVar1 = op_queue_access::next<asio::detail::scheduler_operation>(this->front_);
    this->front_ = psVar1;
    if (this->front_ == (scheduler_operation *)0x0) {
      this->back_ = (scheduler_operation *)0x0;
    }
    op_queue_access::next<asio::detail::scheduler_operation,asio::detail::scheduler_operation>
              (&local_18,(scheduler_operation *)0x0);
  }
  return;
}

Assistant:

void pop()
  {
    if (front_)
    {
      Operation* tmp = front_;
      front_ = op_queue_access::next(front_);
      if (front_ == 0)
        back_ = 0;
      op_queue_access::next(tmp, static_cast<Operation*>(0));
    }
  }